

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.h
# Opt level: O0

void __thiscall
server::collectservmode::droptokens(collectservmode *this,clientinfo *ci,bool penalty)

{
  int iVar1;
  uint uVar2;
  token *ptVar3;
  ENetPacket *packet;
  int local_d4;
  int local_bc;
  int local_b8;
  int local_b4;
  token *t_1;
  int i_1;
  int yaw;
  int numdrops;
  token *local_68;
  token *t;
  undefined1 local_58 [4];
  int i;
  packetbuf p;
  int local_28;
  int expired;
  int totalfriendly;
  int totalenemy;
  int team;
  bool penalty_local;
  clientinfo *ci_local;
  collectservmode *this_local;
  
  if ((this->notgotbases & 1U) == 0) {
    iVar1 = strcmp(ci->team,"good");
    if (iVar1 == 0) {
      local_b4 = 1;
    }
    else {
      iVar1 = strcmp(ci->team,"evil");
      local_b4 = 0;
      if (iVar1 == 0) {
        local_b4 = 2;
      }
    }
    if (penalty) {
      local_b8 = 0;
    }
    else {
      local_b8 = (ci->state).tokens;
    }
    expired = local_b8;
    local_28 = 1;
    p._36_4_ = 0;
    packetbuf::packetbuf((packetbuf *)local_58,300,1);
    t._4_4_ = vector<server::collectservmode::token>::length(&this->tokens);
    while (t._4_4_ = t._4_4_ + -1, -1 < t._4_4_) {
      local_68 = vector<server::collectservmode::token>::operator[](&this->tokens,t._4_4_);
      if (local_68->dropper == ci->clientnum) {
        if (local_68->team == local_b4) {
          local_28 = local_28 + 1;
          iVar1 = local_28;
        }
        else {
          expired = expired + 1;
          iVar1 = expired;
        }
        if (5 < iVar1) {
          if (p._36_4_ == 0) {
            putint((packetbuf *)local_58,0x6d);
          }
          p._36_4_ = p._36_4_ + 1;
          putint((packetbuf *)local_58,local_68->id);
          vector<server::collectservmode::token>::removeunordered
                    ((token *)&yaw,&this->tokens,t._4_4_);
        }
      }
    }
    if (p._36_4_ != 0) {
      putint((packetbuf *)local_58,-1);
    }
    putint((packetbuf *)local_58,0x6e);
    putint((packetbuf *)local_58,ci->clientnum);
    putint((packetbuf *)local_58,(int)((ci->state).o.field_0.field_0.x * 16.0));
    putint((packetbuf *)local_58,(int)((ci->state).o.field_0.field_0.y * 16.0));
    putint((packetbuf *)local_58,(int)((ci->state).o.field_0.field_0.z * 16.0));
    if (penalty) {
      local_bc = 0;
    }
    else {
      local_bc = (ci->state).tokens;
    }
    uVar2 = randomMT();
    for (t_1._0_4_ = 0; (int)t_1 < local_bc + 1; t_1._0_4_ = (int)t_1 + 1) {
      if ((int)t_1 == 0) {
        local_d4 = local_b4;
      }
      else {
        local_d4 = -local_b4;
      }
      ptVar3 = droptoken(this,&(ci->state).o,
                         (uVar2 & 0xffffff) % 0x168 + ((int)t_1 * 0x168) / (local_bc + 1),local_d4,
                         lastmillis,ci->clientnum);
      putint((packetbuf *)local_58,ptVar3->id);
      putint((packetbuf *)local_58,ptVar3->team);
      putint((packetbuf *)local_58,ptVar3->yaw);
    }
    putint((packetbuf *)local_58,-1);
    packet = packetbuf::finalize((packetbuf *)local_58);
    sendpacket(-1,1,packet,-1);
    (ci->state).tokens = 0;
    packetbuf::~packetbuf((packetbuf *)local_58);
  }
  return;
}

Assistant:

void droptokens(clientinfo *ci, bool penalty = false)
    {
        if(notgotbases) return;
        int team = collectteambase(ci->team), totalenemy = penalty ? 0 : ci->state.tokens, totalfriendly = 1, expired = 0;
        packetbuf p(300, ENET_PACKET_FLAG_RELIABLE);
        loopvrev(tokens)
        {
            token &t = tokens[i];
            if(t.dropper == ci->clientnum && (t.team == team ? ++totalfriendly > TOKENLIMIT : ++totalenemy > TOKENLIMIT))
            {
                if(!expired) putint(p, N_EXPIRETOKENS);
                expired++;
                putint(p, t.id);
                tokens.removeunordered(i);        
            }
        }
        if(expired) putint(p, -1);
        putint(p, N_DROPTOKENS);
        putint(p, ci->clientnum);
        putint(p, int(ci->state.o.x*DMF));
        putint(p, int(ci->state.o.y*DMF));
        putint(p, int(ci->state.o.z*DMF));
        int numdrops = 1 + (penalty ? 0 : ci->state.tokens), yaw = rnd(360);
        loopi(numdrops)
        {
            token &t = droptoken(ci->state.o, yaw + (i*360)/numdrops, !i ? team : -team, lastmillis, ci->clientnum); 
            putint(p, t.id);
            putint(p, t.team);
            putint(p, t.yaw);
        }
        putint(p, -1);
        sendpacket(-1, 1, p.finalize());
        ci->state.tokens = 0;
    }